

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O3

int xmlValidateDocumentFinal(xmlValidCtxtPtr ctxt,xmlDocPtr doc)

{
  uint uVar1;
  xmlHashTablePtr table;
  int iVar2;
  
  if (ctxt == (xmlValidCtxtPtr)0x0) {
    iVar2 = 0;
  }
  else if (doc == (xmlDocPtr)0x0) {
    iVar2 = 0;
    xmlErrValid(ctxt,XML_DTD_NO_DOC,"xmlValidateDocumentFinal: doc == NULL\n",(char *)0x0);
  }
  else {
    uVar1 = ctxt->finishDtd;
    ctxt->finishDtd = 0;
    table = (xmlHashTablePtr)doc->refs;
    ctxt->doc = doc;
    ctxt->valid = 1;
    xmlHashScan(table,xmlValidateCheckRefCallback,ctxt);
    ctxt->finishDtd = uVar1;
    iVar2 = ctxt->valid;
  }
  return iVar2;
}

Assistant:

int
xmlValidateDocumentFinal(xmlValidCtxtPtr ctxt, xmlDocPtr doc) {
    xmlRefTablePtr table;
    unsigned int save;

    if (ctxt == NULL)
        return(0);
    if (doc == NULL) {
        xmlErrValid(ctxt, XML_DTD_NO_DOC,
		"xmlValidateDocumentFinal: doc == NULL\n", NULL);
	return(0);
    }

    /* trick to get correct line id report */
    save = ctxt->finishDtd;
    ctxt->finishDtd = 0;

    /*
     * Check all the NOTATION/NOTATIONS attributes
     */
    /*
     * Check all the ENTITY/ENTITIES attributes definition for validity
     */
    /*
     * Check all the IDREF/IDREFS attributes definition for validity
     */
    table = (xmlRefTablePtr) doc->refs;
    ctxt->doc = doc;
    ctxt->valid = 1;
    xmlHashScan(table, xmlValidateCheckRefCallback, ctxt);

    ctxt->finishDtd = save;
    return(ctxt->valid);
}